

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O3

Data * __thiscall
QTzTimeZonePrivate::data
          (Data *__return_storage_ptr__,QTzTimeZonePrivate *this,qint64 forMSecsSinceEpoch)

{
  QTzTransitionRule *pQVar1;
  long lVar2;
  Data *pDVar3;
  QTzTransitionTime *pQVar4;
  QTzTransitionRule *pQVar5;
  int iVar6;
  int iVar7;
  Data *pDVar8;
  QTzTransitionTime *pQVar9;
  undefined4 uVar10;
  ulong uVar11;
  ulong uVar13;
  undefined8 uVar14;
  undefined1 *puVar15;
  undefined1 *puVar17;
  long in_FS_OFFSET;
  QTzTransitionRule rule;
  QArrayDataPointer<QTimeZonePrivate::Data> local_48;
  long local_28;
  ulong uVar12;
  undefined1 *puVar16;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->cached_data).m_posixRule.d.size == 0) ||
     ((lVar2 = (this->cached_data).m_tranTimes.d.size, lVar2 != 0 &&
      (forMSecsSinceEpoch <= (this->cached_data).m_tranTimes.d.ptr[lVar2 + -1].atMSecsSinceEpoch))))
  {
LAB_003fd505:
    uVar12 = (this->cached_data).m_tranTimes.d.size;
    if (uVar12 == 0) {
      (__return_storage_ptr__->abbreviation).d.d = (Data *)0x0;
      (__return_storage_ptr__->abbreviation).d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->abbreviation).d.size = 0;
      __return_storage_ptr__->atMSecsSinceEpoch = -0x8000000000000000;
      __return_storage_ptr__->offsetFromUtc = -0x80000000;
      __return_storage_ptr__->standardTimeOffset = -0x80000000;
      __return_storage_ptr__->daylightTimeOffset = -0x80000000;
    }
    else {
      pQVar4 = (this->cached_data).m_tranTimes.d.ptr;
      pQVar9 = pQVar4;
      do {
        uVar11 = uVar12 >> 1;
        uVar13 = uVar11;
        if (pQVar9[uVar11].atMSecsSinceEpoch <= forMSecsSinceEpoch) {
          uVar13 = ~uVar11 + uVar12;
          pQVar9 = pQVar9 + uVar11 + 1;
        }
        uVar12 = uVar13;
      } while (0 < (long)uVar13);
      if (pQVar9 == pQVar4) {
        uVar14._0_4_ = (this->cached_data).m_preZoneRule.stdOffset;
        uVar14._4_4_ = (this->cached_data).m_preZoneRule.dstOffset;
        uVar10 = *(undefined4 *)&(this->cached_data).m_preZoneRule.abbreviationIndex;
      }
      else {
        pQVar5 = (this->cached_data).m_tranRules.d.ptr;
        pQVar1 = pQVar5 + pQVar9[-1].ruleIndex;
        uVar14._0_4_ = pQVar1->stdOffset;
        uVar14._4_4_ = pQVar1->dstOffset;
        uVar10 = *(undefined4 *)&pQVar5[pQVar9[-1].ruleIndex].abbreviationIndex;
      }
      rule._8_4_ = uVar10;
      rule.stdOffset = (int)uVar14;
      rule.dstOffset = (int)((ulong)uVar14 >> 0x20);
      dataFromRule(__return_storage_ptr__,this,rule,forMSecsSinceEpoch);
    }
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    getPosixTransitions((QList<QTimeZonePrivate::Data> *)&local_48,this,forMSecsSinceEpoch);
    pDVar8 = local_48.ptr;
    puVar16 = (undefined1 *)local_48.size;
    if (local_48.size < 1) {
LAB_003fd497:
      if (((this->cached_data).m_tranTimes.d.size != 0) || (local_48.ptr + local_48.size <= pDVar8))
      {
        QArrayDataPointer<QTimeZonePrivate::Data>::~QArrayDataPointer(&local_48);
        goto LAB_003fd505;
      }
      *(undefined1 **)&__return_storage_ptr__->offsetFromUtc = &DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&__return_storage_ptr__->daylightTimeOffset = &DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->abbreviation).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      __return_storage_ptr__->atMSecsSinceEpoch = (qint64)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->abbreviation).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->abbreviation).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    }
    else {
      do {
        puVar15 = (undefined1 *)((ulong)puVar16 >> 1);
        puVar17 = puVar15;
        if (pDVar8[(long)puVar15].atMSecsSinceEpoch <= forMSecsSinceEpoch) {
          puVar17 = puVar16 + ~(ulong)puVar15;
          pDVar8 = pDVar8 + (long)(puVar15 + 1);
        }
        puVar16 = puVar17;
      } while (0 < (long)puVar17);
      if (pDVar8 <= local_48.ptr) goto LAB_003fd497;
      *(undefined1 **)&__return_storage_ptr__->offsetFromUtc = &DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&__return_storage_ptr__->daylightTimeOffset = &DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->abbreviation).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      __return_storage_ptr__->atMSecsSinceEpoch = (qint64)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->abbreviation).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->abbreviation).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pDVar8 = pDVar8 + -1;
    }
    pDVar3 = (pDVar8->abbreviation).d.d;
    (__return_storage_ptr__->abbreviation).d.d = pDVar3;
    (__return_storage_ptr__->abbreviation).d.ptr = (pDVar8->abbreviation).d.ptr;
    (__return_storage_ptr__->abbreviation).d.size = (pDVar8->abbreviation).d.size;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type_conflict)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> +
           1);
      UNLOCK();
    }
    iVar6 = pDVar8->offsetFromUtc;
    iVar7 = pDVar8->standardTimeOffset;
    __return_storage_ptr__->atMSecsSinceEpoch = pDVar8->atMSecsSinceEpoch;
    __return_storage_ptr__->offsetFromUtc = iVar6;
    __return_storage_ptr__->standardTimeOffset = iVar7;
    __return_storage_ptr__->daylightTimeOffset = pDVar8->daylightTimeOffset;
    __return_storage_ptr__->atMSecsSinceEpoch = forMSecsSinceEpoch;
    QArrayDataPointer<QTimeZonePrivate::Data>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QTimeZonePrivate::Data QTzTimeZonePrivate::data(qint64 forMSecsSinceEpoch) const
{
    // If the required time is after the last transition (or there were none)
    // and we have a POSIX rule, then use it:
    if (!cached_data.m_posixRule.isEmpty()
        && (tranCache().isEmpty() || tranCache().last().atMSecsSinceEpoch < forMSecsSinceEpoch)) {
        QList<Data> posixTrans = getPosixTransitions(forMSecsSinceEpoch);
        auto it = std::partition_point(posixTrans.cbegin(), posixTrans.cend(),
                                       [forMSecsSinceEpoch] (const Data &at) {
                                           return at.atMSecsSinceEpoch <= forMSecsSinceEpoch;
                                       });
        // Use most recent, if any in the past; or the first if we have no other rules:
        if (it > posixTrans.cbegin() || (tranCache().isEmpty() && it < posixTrans.cend())) {
            Data data = *(it > posixTrans.cbegin() ? it - 1 : it);
            data.atMSecsSinceEpoch = forMSecsSinceEpoch;
            return data;
        }
    }
    if (tranCache().isEmpty()) // Only possible if !isValid()
        return {};

    // Otherwise, use the rule for the most recent or first transition:
    auto last = std::partition_point(tranCache().cbegin(), tranCache().cend(),
                                     [forMSecsSinceEpoch] (QTzTransitionTime at) {
                                         return at.atMSecsSinceEpoch <= forMSecsSinceEpoch;
                                     });
    if (last == tranCache().cbegin())
        return dataFromRule(cached_data.m_preZoneRule, forMSecsSinceEpoch);

    --last;
    return dataFromRule(cached_data.m_tranRules.at(last->ruleIndex), forMSecsSinceEpoch);
}